

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

Gia_Man_t * Gia_ManFromIfAig(If_Man_t *pIfMan)

{
  uint uVar1;
  If_Par_t *pIVar2;
  uint uVar3;
  Gia_Man_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  uint *puVar4;
  If_Obj_t *pIVar5;
  Gia_Man_t *pGVar6;
  int i;
  ulong uVar7;
  int iVar8;
  
  pIVar2 = pIfMan->pPars;
  if (pIVar2->pLutStruct != (char *)0x0) {
    __assert_fail("pIfMan->pPars->pLutStruct == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                  ,0x382,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
  }
  if (((pIVar2->fDelayOpt == 0) && (pIVar2->fDsdBalance == 0)) && (pIVar2->fUserRecLib == 0)) {
    __assert_fail("pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                  ,899,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
  }
  p = Gia_ManStart(pIfMan->vObjs->nSize);
  Gia_ManHashAlloc(p);
  p_00 = Vec_IntAlloc(0x10000);
  p_01 = Vec_IntAlloc(0x10);
  i = 0;
  do {
    if (pIfMan->vObjs->nSize <= i) {
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      pGVar6 = Gia_ManRehash(p,0);
      Gia_ManStop(p);
      return pGVar6;
    }
    puVar4 = (uint *)Vec_PtrEntry(pIfMan->vObjs,i);
    uVar1 = *puVar4;
    if ((uVar1 & 0xe) == 2 || puVar4[3] != 0) {
      uVar3 = uVar1 & 0xf;
      switch(uVar3) {
      case 1:
        break;
      case 2:
        uVar3 = Gia_ManAppendCi(p);
        break;
      case 3:
        iVar8 = Abc_LitNotCond(*(int *)(*(long *)(puVar4 + 6) + 0x40),uVar1 >> 4 & 1);
        uVar3 = Gia_ManAppendCo(p,iVar8);
        break;
      case 4:
        p_01->nSize = 0;
        uVar7 = 0;
        while ((uVar7 < *(byte *)((long)puVar4 + 0x6f) &&
               (pIVar5 = If_ManObj(pIfMan,puVar4[uVar7 + 0x1c]), pIVar5 != (If_Obj_t *)0x0))) {
          Vec_IntPush(p_01,(pIVar5->field_22).iCopy);
          uVar7 = uVar7 + 1;
        }
        pIVar2 = pIfMan->pPars;
        if (pIVar2->fDelayOpt == 0) {
          if (pIVar2->fDsdBalance == 0) {
            if (pIVar2->fUserRecLib == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                            ,0x3a4,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
            }
            uVar3 = Abc_RecToGia3(p,pIfMan,(If_Cut_t *)(puVar4 + 0x14),p_01,0);
            break;
          }
          iVar8 = 1;
        }
        else {
          iVar8 = 0;
        }
        uVar3 = Gia_ManBuildFromMini(p,pIfMan,(If_Cut_t *)(puVar4 + 0x14),p_01,p_00,0,iVar8);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                      ,0x3ac,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
      }
      puVar4[0x10] = uVar3;
    }
    i = i + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFromIfAig( If_Man_t * pIfMan )
{
    int fHash = 0;
    Gia_Man_t * pNew, * pTemp;
    If_Obj_t * pIfObj, * pIfLeaf;
    If_Cut_t * pCutBest;
    Vec_Int_t * vLeaves;
    Vec_Int_t * vAig;
    int i, k;
    assert( pIfMan->pPars->pLutStruct == NULL );
    assert( pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib );
    // create new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    Gia_ManHashAlloc( pNew );
    // iterate through nodes used in the mapping
    vAig = Vec_IntAlloc( 1 << 16 );
    vLeaves = Vec_IntAlloc( 16 );
//    If_ManForEachObj( pIfMan, pIfObj, i )
//        pIfObj->iCopy = 0;
    If_ManForEachObj( pIfMan, pIfObj, i )
    {
        if ( pIfObj->nRefs == 0 && !If_ObjIsTerm(pIfObj) )
            continue;
        if ( If_ObjIsAnd(pIfObj) )
        {
            pCutBest = If_ObjCutBest( pIfObj );
            // if the cut does not offer delay improvement
//            if ( (int)pIfObj->Level <= (int)pCutBest->Delay )
//            {
//                Gia_ManFromIfAig_rec( pNew, pIfMan, pIfObj );
//                continue;
//            }
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, k )
                Vec_IntPush( vLeaves, pIfLeaf->iCopy );
            // get the functionality
            if ( pIfMan->pPars->fDelayOpt )
                pIfObj->iCopy = Gia_ManBuildFromMini( pNew, pIfMan, pCutBest, vLeaves, vAig, fHash, 0 );
            else if ( pIfMan->pPars->fDsdBalance )
                pIfObj->iCopy = Gia_ManBuildFromMini( pNew, pIfMan, pCutBest, vLeaves, vAig, fHash, 1 );
            else if ( pIfMan->pPars->fUserRecLib )
                pIfObj->iCopy = Abc_RecToGia3( pNew, pIfMan, pCutBest, vLeaves, fHash );
            else assert( 0 );
        }
        else if ( If_ObjIsCi(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCi(pNew);
        else if ( If_ObjIsCo(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCo( pNew, Abc_LitNotCond(If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj)) );
        else if ( If_ObjIsConst1(pIfObj) )
            pIfObj->iCopy = 1;
        else assert( 0 );
    }
    Vec_IntFree( vAig );
    Vec_IntFree( vLeaves );
    pNew = Gia_ManRehash( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
    return pNew;
}